

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_signal.cc
# Opt level: O0

void flyd::Signal::SignalHandler(int signo,siginfo_t *siginfo,void *ucontext)

{
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  LogLevel LVar1;
  mapped_type *pp_Var2;
  LogStream *this;
  self *this_00;
  long in_RSI;
  int in_EDI;
  char *action;
  LogLevel in_stack_ffffffffffffbfc8;
  int in_stack_ffffffffffffbfcc;
  Logger *in_stack_ffffffffffffbfd0;
  char (*in_stack_ffffffffffffbfd8) [103];
  Logger *pLVar3;
  SourceFile *in_stack_ffffffffffffbfe0;
  Logger *in_stack_ffffffffffffc000;
  Logger local_3fc0;
  Logger local_2fd8;
  Logger local_1ff0;
  char *local_1018;
  Logger local_ff0;
  long local_10;
  int local_4;
  
  local_10 = in_RSI;
  local_4 = in_EDI;
  LVar1 = muduo::Logger::logLevel();
  if ((int)LVar1 < 3) {
    muduo::Logger::SourceFile::SourceFile<103>(in_stack_ffffffffffffbfe0,in_stack_ffffffffffffbfd8);
    file._8_8_ = in_stack_ffffffffffffbfe0;
    file.data_ = *in_stack_ffffffffffffbfd8;
    muduo::Logger::Logger(in_stack_ffffffffffffbfd0,file,in_stack_ffffffffffffbfcc);
    muduo::Logger::stream(&local_ff0);
    muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffffbfe0,*in_stack_ffffffffffffbfd8);
    muduo::Logger::~Logger(in_stack_ffffffffffffc000);
  }
  pp_Var2 = std::
            unordered_map<int,_void_(*)(int,_siginfo_t_*,_void_*),_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_void_(*)(int,_siginfo_t_*,_void_*)>_>_>
            ::operator[]((unordered_map<int,_void_(*)(int,_siginfo_t_*,_void_*),_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_void_(*)(int,_siginfo_t_*,_void_*)>_>_>
                          *)in_stack_ffffffffffffbfd0,
                         (key_type *)CONCAT44(in_stack_ffffffffffffbfcc,in_stack_ffffffffffffbfc8));
  if (*pp_Var2 == (mapped_type)0x0) {
    muduo::Logger::SourceFile::SourceFile<103>(in_stack_ffffffffffffbfe0,in_stack_ffffffffffffbfd8);
    file_00._8_8_ = in_stack_ffffffffffffbfe0;
    file_00.data_ = *in_stack_ffffffffffffbfd8;
    muduo::Logger::Logger
              (in_stack_ffffffffffffbfd0,file_00,in_stack_ffffffffffffbfcc,in_stack_ffffffffffffbfc8
              );
    muduo::Logger::stream(&local_1ff0);
    muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffffbfe0,*in_stack_ffffffffffffbfd8);
    muduo::Logger::~Logger(in_stack_ffffffffffffc000);
  }
  local_1018 = " ";
  if ((local_10 == 0) || (*(int *)(local_10 + 0x10) == 0)) {
    LVar1 = muduo::Logger::logLevel();
    if ((int)LVar1 < 3) {
      muduo::Logger::SourceFile::SourceFile<103>
                (in_stack_ffffffffffffbfe0,in_stack_ffffffffffffbfd8);
      pLVar3 = &local_3fc0;
      file_02._8_8_ = in_stack_ffffffffffffbfe0;
      file_02.data_ = (char *)pLVar3;
      muduo::Logger::Logger(in_stack_ffffffffffffbfd0,file_02,in_stack_ffffffffffffbfcc);
      this = muduo::Logger::stream(pLVar3);
      this_00 = muduo::LogStream::operator<<(this,(char *)pLVar3);
      muduo::LogStream::operator<<(this_00,in_stack_ffffffffffffbfcc);
      muduo::Logger::~Logger(in_stack_ffffffffffffc000);
    }
  }
  else {
    LVar1 = muduo::Logger::logLevel();
    if ((int)LVar1 < 3) {
      muduo::Logger::SourceFile::SourceFile<103>
                (in_stack_ffffffffffffbfe0,in_stack_ffffffffffffbfd8);
      pLVar3 = &local_2fd8;
      file_01._8_8_ = in_stack_ffffffffffffbfe0;
      file_01.data_ = *in_stack_ffffffffffffbfd8;
      muduo::Logger::Logger(in_stack_ffffffffffffbfd0,file_01,in_stack_ffffffffffffbfcc);
      muduo::Logger::stream(pLVar3);
      muduo::LogStream::operator<<
                ((LogStream *)in_stack_ffffffffffffbfe0,*in_stack_ffffffffffffbfd8);
      muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffffbfd0,in_stack_ffffffffffffbfcc)
      ;
      muduo::LogStream::operator<<
                ((LogStream *)in_stack_ffffffffffffbfe0,*in_stack_ffffffffffffbfd8);
      muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffffbfd0,in_stack_ffffffffffffbfcc)
      ;
      muduo::Logger::~Logger(pLVar3);
    }
  }
  if (local_4 == 0x11) {
    flyd_process_get_status();
  }
  return;
}

Assistant:

void flyd::Signal::SignalHandler(int signo, siginfo_t *siginfo, void *ucontext)
{
    LOG_INFO << "来信号了";
    char            *action; //一个字符串，用于记录一个动作字符串以往日志文件中写
    if(signals_[signo] == NULL)
    {
        LOG_WARN << "该信号未注册";
    }

    action = (char* )" ";//信号的动作

    if(flyd_process == FLYD_MASTER_PROCESS)//MASTER进程，管理进程，信号处理比较多
    {

    }
    else if(flyd_process == FLYD_WORK_PROCESS)//WORK进程，具体干活的进程，处理信号比较少
    {

    }
    else{//未定义的其他进程，暂时什么都不干

    }

    if(siginfo && siginfo->si_pid)
    {
        LOG_INFO << "signal is " << signo << " ,si_pid is " << siginfo->si_pid;
    }
    else
    {
        LOG_INFO << "signal is " << signo ;
    }


    //子进程状态有变化，通常是意外退出【既然官方是在这里处理，我们也学习官方在这里处理】
    if (signo == SIGCHLD)
    {
        flyd_process_get_status(); //获取子进程的结束状态
    } //end if


}